

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

FT_F26Dot6 Round_To_Half_Grid(TT_ExecContext exc,FT_F26Dot6 distance,FT_F26Dot6 compensation)

{
  long lVar1;
  undefined8 local_28;
  FT_F26Dot6 val;
  FT_F26Dot6 compensation_local;
  FT_F26Dot6 distance_local;
  TT_ExecContext exc_local;
  
  if (distance < 0) {
    lVar1 = (compensation - distance & 0xffffffffffffffc0U) + 0x20;
    local_28 = -lVar1;
    if (lVar1 < 0) {
      local_28 = -0x20;
    }
  }
  else {
    local_28 = (distance + compensation & 0xffffffffffffffc0U) + 0x20;
    if (local_28 < 0) {
      local_28 = 0x20;
    }
  }
  return local_28;
}

Assistant:

static FT_F26Dot6
  Round_To_Half_Grid( TT_ExecContext  exc,
                      FT_F26Dot6      distance,
                      FT_F26Dot6      compensation )
  {
    FT_F26Dot6  val;

    FT_UNUSED( exc );


    if ( distance >= 0 )
    {
      val = ADD_LONG( FT_PIX_FLOOR( ADD_LONG( distance, compensation ) ),
                      32 );
      if ( val < 0 )
        val = 32;
    }
    else
    {
      val = NEG_LONG( ADD_LONG( FT_PIX_FLOOR( SUB_LONG( compensation,
                                                        distance ) ),
                                32 ) );
      if ( val > 0 )
        val = -32;
    }

    return val;
  }